

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuSingle.c
# Opt level: O0

int Fxu_SingleCountCoincidence(Fxu_Matrix *p,Fxu_Var *pVar1,Fxu_Var *pVar2)

{
  int local_34;
  Fxu_Lit *pFStack_30;
  int Result;
  Fxu_Lit *pLit2;
  Fxu_Lit *pLit1;
  Fxu_Var *pVar2_local;
  Fxu_Var *pVar1_local;
  Fxu_Matrix *p_local;
  
  local_34 = 0;
  pLit2 = (pVar1->lLits).pHead;
  pFStack_30 = (pVar2->lLits).pHead;
  while( true ) {
    while( true ) {
      while ((pLit2 != (Fxu_Lit *)0x0 && (pFStack_30 != (Fxu_Lit *)0x0))) {
        if (pLit2->pCube->pVar->iVar == pFStack_30->pCube->pVar->iVar) {
          if (pLit2->iCube == pFStack_30->iCube) {
            pLit2 = pLit2->pVNext;
            pFStack_30 = pFStack_30->pVNext;
            local_34 = local_34 + 1;
          }
          else if (pLit2->iCube < pFStack_30->iCube) {
            pLit2 = pLit2->pVNext;
          }
          else {
            pFStack_30 = pFStack_30->pVNext;
          }
        }
        else if (pLit2->pCube->pVar->iVar < pFStack_30->pCube->pVar->iVar) {
          pLit2 = pLit2->pVNext;
        }
        else {
          pFStack_30 = pFStack_30->pVNext;
        }
      }
      if ((pLit2 == (Fxu_Lit *)0x0) || (pFStack_30 != (Fxu_Lit *)0x0)) break;
      pLit2 = pLit2->pVNext;
    }
    if ((pLit2 != (Fxu_Lit *)0x0) || (pFStack_30 == (Fxu_Lit *)0x0)) break;
    pFStack_30 = pFStack_30->pVNext;
  }
  return local_34;
}

Assistant:

int Fxu_SingleCountCoincidence( Fxu_Matrix * p, Fxu_Var * pVar1, Fxu_Var * pVar2 )
{
	Fxu_Lit * pLit1, * pLit2;
	int Result;

	// compute the coincidence count
	Result = 0;
	pLit1  = pVar1->lLits.pHead;
	pLit2  = pVar2->lLits.pHead;
	while ( 1 )
	{
		if ( pLit1 && pLit2 )
		{
			if ( pLit1->pCube->pVar->iVar == pLit2->pCube->pVar->iVar )
			{ // the variables are the same
			    if ( pLit1->iCube == pLit2->iCube )
			    { // the literals are the same
				    pLit1 = pLit1->pVNext;
				    pLit2 = pLit2->pVNext;
				    // add this literal to the coincidence
				    Result++;
			    }
			    else if ( pLit1->iCube < pLit2->iCube )
				    pLit1 = pLit1->pVNext;
			    else
				    pLit2 = pLit2->pVNext;
			}
			else if ( pLit1->pCube->pVar->iVar < pLit2->pCube->pVar->iVar )
				pLit1 = pLit1->pVNext;
			else
				pLit2 = pLit2->pVNext;
		}
		else if ( pLit1 && !pLit2 )
			pLit1 = pLit1->pVNext;
		else if ( !pLit1 && pLit2 )
			pLit2 = pLit2->pVNext;
		else
			break;
	}
	return Result;
}